

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_dup2_x1(ExecutionEngine *this)

{
  VMStack *this_00;
  Frame *this_01;
  Value operand;
  Value operand_00;
  Value operand_01;
  ValueType VStack_4c;
  Value value_3;
  Value value_2;
  Value value_1;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  operand = Frame::popTopOfOperandStack(this_01);
  operand_00 = Frame::popTopOfOperandStack(this_01);
  operand_01 = Frame::popTopOfOperandStack(this_01);
  value_3.data.longValue._4_4_ = operand_00.type;
  if (value_3.data.longValue._4_4_ == 6) {
    __assert_fail("value_2.type != ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x765,"void ExecutionEngine::i_dup2_x1()");
  }
  if (value_3.data.longValue._4_4_ == 7) {
    __assert_fail("value_2.type != ValueType::DOUBLE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x766,"void ExecutionEngine::i_dup2_x1()");
  }
  VStack_4c = operand_01.type;
  if (VStack_4c == LONG) {
    __assert_fail("value_3.type != ValueType::LONG",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0x767,"void ExecutionEngine::i_dup2_x1()");
  }
  if (VStack_4c != DOUBLE) {
    Frame::pushIntoOperandStack(this_01,operand_00);
    Frame::pushIntoOperandStack(this_01,operand);
    Frame::pushIntoOperandStack(this_01,operand_01);
    Frame::pushIntoOperandStack(this_01,operand_00);
    Frame::pushIntoOperandStack(this_01,operand);
    this_01->pc = this_01->pc + 1;
    return;
  }
  __assert_fail("value_3.type != ValueType::DOUBLE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0x768,"void ExecutionEngine::i_dup2_x1()");
}

Assistant:

void ExecutionEngine::i_dup2_x1() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();

    Value value_1 = topFrame->popTopOfOperandStack();
    Value value_2 = topFrame->popTopOfOperandStack();
    Value value_3 = topFrame->popTopOfOperandStack();

    assert(value_2.type != ValueType::LONG);
    assert(value_2.type != ValueType::DOUBLE);
    assert(value_3.type != ValueType::LONG);
    assert(value_3.type != ValueType::DOUBLE);

    topFrame->pushIntoOperandStack(value_2);
    topFrame->pushIntoOperandStack(value_1);
    topFrame->pushIntoOperandStack(value_3);
    topFrame->pushIntoOperandStack(value_2);
    topFrame->pushIntoOperandStack(value_1);

    topFrame->pc += 1;
}